

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O0

aom_codec_err_t aom_codec_set_option(aom_codec_ctx_t *ctx,char *name,char *value)

{
  undefined4 uVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else if (((*(long *)(in_RDI + 8) == 0) || (*(long *)(in_RDI + 0x30) == 0)) ||
          (*(long *)(*(long *)(in_RDI + 8) + 0x90) == 0)) {
    *(undefined4 *)(in_RDI + 0x10) = 1;
    local_4 = AOM_CODEC_ERROR;
  }
  else {
    uVar1 = (**(code **)(*(long *)(in_RDI + 8) + 0x90))
                      (*(undefined8 *)(in_RDI + 0x30),in_RSI,in_RDX);
    *(undefined4 *)(in_RDI + 0x10) = uVar1;
    local_4 = *(aom_codec_err_t *)(in_RDI + 0x10);
  }
  return local_4;
}

Assistant:

aom_codec_err_t aom_codec_set_option(aom_codec_ctx_t *ctx, const char *name,
                                     const char *value) {
  if (!ctx) {
    return AOM_CODEC_INVALID_PARAM;
  }
  if (!ctx->iface || !ctx->priv || !ctx->iface->set_option) {
    ctx->err = AOM_CODEC_ERROR;
    return AOM_CODEC_ERROR;
  }
  ctx->err =
      ctx->iface->set_option((aom_codec_alg_priv_t *)ctx->priv, name, value);
  return ctx->err;
}